

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealer.cpp
# Opt level: O0

void __thiscall Sealer::CalculateMerkRoot(Sealer *this,Cache *ca,Blockchain *bc)

{
  bool bVar1;
  ostream *poVar2;
  string local_268 [32];
  string local_248 [48];
  queue<Message,_std::deque<Message,_std::allocator<Message>_>_> local_218;
  undefined1 local_1c8 [40];
  stringstream ss;
  ostream local_198 [376];
  Blockchain *local_20;
  Blockchain *bc_local;
  Cache *ca_local;
  Sealer *this_local;
  
  local_20 = bc;
  bc_local = (Blockchain *)ca;
  ca_local = (Cache *)this;
  bVar1 = IsCacheEmpty(this,ca);
  if (!bVar1) {
    this->trans_count = this->trans_count + 1;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x20));
    Cache::GetTransQueue(&local_218,(Cache *)bc_local);
    std::queue<Message,_std::deque<Message,_std::allocator<Message>_>_>::front(&local_218);
    Message::diggest_abi_cxx11_((Message *)local_1c8);
    std::__cxx11::string::operator=((string *)this,(string *)local_1c8);
    std::__cxx11::string::~string((string *)local_1c8);
    std::queue<Message,_std::deque<Message,_std::allocator<Message>_>_>::~queue(&local_218);
    Cache::PopTransQueue((Cache *)bc_local);
    poVar2 = std::operator<<(local_198,(string *)&this->merkle_root);
    std::operator<<(poVar2,(string *)this);
    std::__cxx11::stringstream::str();
    sha256(local_248);
    std::__cxx11::string::operator=((string *)&this->merkle_root,(string *)local_248);
    std::__cxx11::string::~string((string *)local_248);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x20));
  }
  return;
}

Assistant:

void  Sealer::CalculateMerkRoot(Cache & ca,Blockchain & bc)  {
    if(!IsCacheEmpty(ca))
    {
        trans_count++;
        //std::cout << "交易池中的交易数："<<trans_count << std::endl;
        std::stringstream ss;
        str = ca.GetTransQueue().front().diggest();
        ca.PopTransQueue();
        ss << merkle_root << str;
        merkle_root = sha256(ss.str());
    }

}